

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_353bb::ImageManager::~ImageManager(ImageManager *this)

{
  bool bVar1;
  reference ppCVar2;
  Image *pIVar3;
  reference out;
  reference ppRVar4;
  long in_RDI;
  size_t i;
  iterator data;
  vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<(anonymous_namespace)::ConstReferenceOwner_**,_std::vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>_>
  *in_stack_ffffffffffffffc0;
  Image *in;
  ImageManager *in_stack_ffffffffffffffd0;
  Image *local_20;
  __normal_iterator<(anonymous_namespace)::ConstReferenceOwner_**,_std::vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>_>
  local_10 [2];
  
  local_10[0]._M_current =
       (ConstReferenceOwner **)
       std::
       vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    std::
    vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
    ::end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<(anonymous_namespace)::ConstReferenceOwner_**,_std::vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<(anonymous_namespace)::ConstReferenceOwner_**,_std::vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffd0 = (ImageManager *)*ppCVar2;
    if (in_stack_ffffffffffffffd0 != (ImageManager *)0x0) {
      operator_delete(in_stack_ffffffffffffffd0);
    }
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::ConstReferenceOwner_**,_std::vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>_>
    ::operator++(local_10);
  }
  local_20 = (Image *)0x0;
  while( true ) {
    in = local_20;
    pIVar3 = (Image *)std::
                      vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                      ::size((vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                              *)(in_RDI + 0x20));
    if (pIVar3 <= in) break;
    out = std::
          vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                        *)(in_RDI + 0x50),(size_type)local_20);
    std::
    vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
    ::operator[]((vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                  *)(in_RDI + 0x20),(size_type)local_20);
    _restore(in_stack_ffffffffffffffd0,in,out);
    ppRVar4 = std::
              vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
              ::operator[]((vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                            *)(in_RDI + 0x20),(size_type)local_20);
    if (*ppRVar4 != (value_type)0x0) {
      operator_delete(*ppRVar4);
    }
    local_20 = (Image *)((long)&local_20->_vptr_ImageTemplate + 1);
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_ffffffffffffffd0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_ffffffffffffffd0);
  std::
  vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ::~vector((vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
             *)in_stack_ffffffffffffffd0);
  std::
  vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ::~vector((vector<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
             *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

~ImageManager()
        {
            for ( std::vector<ConstReferenceOwner *>::iterator data = _input.begin(); data != _input.end(); ++data )
                delete *data;

            for ( size_t i = 0u; i < _output.size(); ++i ) {
                _restore( _outputClone[i], _output[i]->data );

                delete _output[i];
            }
        }